

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O1

int hdr_encode_compressed(hdr_histogram *h,uint8_t **compressed_histogram,size_t *compressed_len)

{
  double dVar1;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  int iVar5;
  undefined4 *__ptr;
  uint8_t *__ptr_00;
  uint uVar6;
  int iVar7;
  long signed_value;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uLongf dest_len;
  long local_48;
  uint8_t **local_40;
  size_t *local_38;
  
  iVar3 = counts_index_for(h,h->max_value);
  uVar6 = iVar3 + 1U;
  if (h->counts_len <= (int)(iVar3 + 1U)) {
    uVar6 = h->counts_len;
  }
  __ptr = (undefined4 *)calloc((long)(int)uVar6 * 9 + 0x28,1);
  uVar9 = 0;
  if (__ptr != (undefined4 *)0x0) {
    local_40 = compressed_histogram;
    local_38 = compressed_len;
    if (0 < (int)uVar6) {
      uVar4 = 0;
      uVar9 = 0;
      do {
        signed_value = h->counts[(int)uVar4];
        uVar10 = uVar4 + 1;
        if (signed_value == 0) {
          iVar5 = 1;
          if ((int)uVar10 < (int)uVar6) {
            uVar8 = (ulong)(int)uVar10;
            iVar5 = uVar6 - uVar4;
            iVar7 = -1;
            do {
              if (h->counts[uVar8] != 0) {
                iVar5 = -iVar7;
                uVar10 = uVar4 - iVar7;
                break;
              }
              uVar8 = uVar8 + 1;
              iVar7 = iVar7 + -1;
              uVar10 = uVar6;
            } while (uVar6 != uVar8);
          }
          signed_value = (long)-iVar5;
        }
        uVar4 = uVar10;
        iVar5 = zig_zag_encode_i64((uint8_t *)((long)__ptr + (long)(int)uVar9 + 0x28),signed_value);
        uVar9 = uVar9 + iVar5;
      } while ((int)uVar4 < (int)uVar6);
    }
    *__ptr = 0x1393841c;
    __ptr[1] = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar6 = h->normalizing_index_offset;
    __ptr[2] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = h->significant_figures;
    __ptr[3] = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar8 = h->lowest_discernible_value;
    *(ulong *)(__ptr + 4) =
         uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    uVar8 = h->highest_trackable_value;
    *(ulong *)(__ptr + 6) =
         uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    dVar1 = h->conversion_ratio;
    *(ulong *)(__ptr + 8) =
         (ulong)dVar1 >> 0x38 | ((ulong)dVar1 & 0xff000000000000) >> 0x28 |
         ((ulong)dVar1 & 0xff0000000000) >> 0x18 | ((ulong)dVar1 & 0xff00000000) >> 8 |
         ((ulong)dVar1 & 0xff000000) << 8 | ((ulong)dVar1 & 0xff0000) << 0x18 |
         ((ulong)dVar1 & 0xff00) << 0x28 | (long)dVar1 << 0x38;
    local_48 = compressBound((long)(int)uVar9 + 0x28);
    __ptr_00 = (uint8_t *)malloc(local_48 + 8);
    if (__ptr_00 != (uint8_t *)0x0) {
      iVar5 = compress(__ptr_00 + 8,&local_48,__ptr,(long)(int)uVar9 + 0x28);
      if (iVar5 == 0) {
        __ptr_00[0] = '\x1c';
        __ptr_00[1] = 0x84;
        __ptr_00[2] = 0x93;
        __ptr_00[3] = '\x14';
        uVar6 = (uint)local_48;
        *(uint *)(__ptr_00 + 4) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        *local_40 = __ptr_00;
        *local_38 = local_48 + 8;
        bVar2 = false;
        iVar5 = 0;
      }
      else {
        iVar5 = -0x752c;
        bVar2 = true;
      }
      goto LAB_001052a5;
    }
  }
  bVar2 = false;
  __ptr_00 = (uint8_t *)0x0;
  iVar5 = 0xc;
LAB_001052a5:
  free(__ptr);
  if (bVar2) {
    free(__ptr_00);
  }
  return iVar5;
}

Assistant:

int hdr_encode_compressed(
    struct hdr_histogram* h,
    uint8_t** compressed_histogram,
    size_t* compressed_len)
{
    encoding_flyweight_v1_t* encoded = NULL;
    compression_flyweight_t* compressed = NULL;
    int i;
    int result = 0;
    int data_index = 0;
    int32_t payload_len;
    uLong encoded_size;
    uLongf dest_len;
    size_t compressed_size;

    int32_t len_to_max = counts_index_for(h, h->max_value) + 1;
    int32_t counts_limit = len_to_max < h->counts_len ? len_to_max : h->counts_len;

    const size_t encoded_len = SIZEOF_ENCODING_FLYWEIGHT_V1 + MAX_BYTES_LEB128 * (size_t) counts_limit;
    if ((encoded = (encoding_flyweight_v1_t*) hdr_calloc(encoded_len, sizeof(uint8_t))) == NULL)
    {
        FAIL_AND_CLEANUP(cleanup, result, ENOMEM);
    }

    for (i = 0; i < counts_limit;)
    {
        int64_t value = h->counts[i];
        i++;

        if (value == 0)
        {
            int32_t zeros = 1;

            while (i < counts_limit && 0 == h->counts[i])
            {
                zeros++;
                i++;
            }

            data_index += zig_zag_encode_i64(&encoded->counts[data_index], -zeros);
        }
        else
        {
            data_index += zig_zag_encode_i64(&encoded->counts[data_index], value);
        }
    }

    payload_len = data_index;
    encoded_size = SIZEOF_ENCODING_FLYWEIGHT_V1 + data_index;

    encoded->cookie                   = htobe32(V2_ENCODING_COOKIE | 0x10U);
    encoded->payload_len              = htobe32(payload_len);
    encoded->normalizing_index_offset = htobe32(h->normalizing_index_offset);
    encoded->significant_figures      = htobe32(h->significant_figures);
    encoded->lowest_discernible_value   = htobe64(h->lowest_discernible_value);
    encoded->highest_trackable_value  = htobe64(h->highest_trackable_value);
    encoded->conversion_ratio_bits    = htobe64(double_to_int64_bits(h->conversion_ratio));


    /* Estimate the size of the compressed histogram. */
    dest_len = compressBound(encoded_size);
    compressed_size = SIZEOF_COMPRESSION_FLYWEIGHT + dest_len;

    if ((compressed = (compression_flyweight_t*) hdr_malloc(compressed_size)) == NULL)
    {
        FAIL_AND_CLEANUP(cleanup, result, ENOMEM);
    }

    if (Z_OK != compress(compressed->data, &dest_len, (Bytef*) encoded, encoded_size))
    {
        FAIL_AND_CLEANUP(cleanup, result, HDR_DEFLATE_FAIL);
    }

    compressed->cookie = htobe32(V2_COMPRESSION_COOKIE | 0x10U);
    compressed->length = htobe32((int32_t)dest_len);

    *compressed_histogram = (uint8_t*) compressed;
    *compressed_len = SIZEOF_COMPRESSION_FLYWEIGHT + dest_len;

    cleanup:
    hdr_free(encoded);
    if (result == HDR_DEFLATE_FAIL)
    {
        hdr_free(compressed);
    }

    return result;
}